

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveConditional.cpp
# Opt level: O2

void __thiscall
CDirectiveConditional::setContent
          (CDirectiveConditional *this,
          unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *ifBlock,
          unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *elseBlock)

{
  std::__uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator=
            ((__uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
             &this->ifBlock,
             (__uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)ifBlock)
  ;
  std::__uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator=
            ((__uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
             &this->elseBlock,
             (__uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
             elseBlock);
  return;
}

Assistant:

void CDirectiveConditional::setContent(std::unique_ptr<CAssemblerCommand> ifBlock, std::unique_ptr<CAssemblerCommand> elseBlock)
{
	this->ifBlock = std::move(ifBlock);
	this->elseBlock = std::move(elseBlock);
}